

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O3

ssize_t __thiscall http::Request::send(Request *this,int __fd,void *__buf,size_t __n,int __flags)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *__nptr;
  bool bVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar7;
  char cVar8;
  int iVar9;
  long *plVar10;
  long *plVar11;
  undefined8 *puVar12;
  ssize_t sVar13;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var14;
  long extraout_RAX;
  long lVar15;
  size_type sVar16;
  int *piVar17;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var18;
  runtime_error *this_00;
  RequestError *this_01;
  system_error *this_02;
  error_category *__ecat;
  socklen_t __len;
  size_type *psVar19;
  ulong *puVar20;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *extraout_RDX_05;
  uchar *extraout_RDX_06;
  uchar *extraout_RDX_07;
  uchar *extraout_RDX_08;
  uchar *extraout_RDX_09;
  uchar *extraout_RDX_10;
  uchar *extraout_RDX_11;
  uchar *puVar21;
  void *pvVar22;
  ulong uVar23;
  undefined4 in_register_00000034;
  InternetProtocol *pIVar24;
  char cVar25;
  undefined8 uVar26;
  undefined4 in_register_00000084;
  long lVar27;
  bool bVar28;
  uchar *puVar29;
  void *__buf_00;
  ulong uVar30;
  uchar *puVar31;
  ulong uVar32;
  uchar *puVar33;
  undefined1 auVar34 [16];
  uint8_t crlf [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> responseData;
  Socket socket;
  Response *response;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string headerValue;
  string __str_2;
  string headerData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> requestData;
  addrinfo *info;
  addrinfo hints;
  uint8_t tempBuffer [4096];
  undefined2 local_11aa;
  value_type local_11a8;
  uchar *local_1188;
  uchar *puStack_1180;
  undefined8 local_1178;
  Socket local_116c;
  ulong local_1168;
  Request *local_1160;
  ulong *local_1158;
  long lStack_1150;
  ulong local_1148;
  long lStack_1140;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  long *local_1110;
  ulong local_1108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1100;
  addrinfo *local_10e0;
  ulong local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10d0;
  ulong local_10c8;
  ulong local_10c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10b8;
  long local_10b0;
  long local_10a8;
  long lStack_10a0;
  undefined1 *local_1098;
  void *local_1090;
  long local_1088;
  addrinfo *local_1078;
  char *local_1070;
  addrinfo local_1068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038 [128];
  
  pIVar24 = (InternetProtocol *)CONCAT44(in_register_00000034,__fd);
  local_1160 = this;
  local_1110 = (long *)__n;
  iVar9 = std::__cxx11::string::compare((char *)(pIVar24 + 8));
  if (iVar9 != 0) {
LAB_00150378:
    this_01 = (RequestError *)__cxa_allocate_exception(0x10);
    RequestError::RequestError(this_01,"Only HTTP scheme is supported");
    __cxa_throw(this_01,&RequestError::typeinfo,std::logic_error::~logic_error);
  }
  local_1068.ai_canonname = (char *)0x0;
  local_1068.ai_next = (addrinfo *)0x0;
  local_1068.ai_addrlen = 0;
  local_1068._20_4_ = 0;
  local_1068.ai_addr = (sockaddr *)0x0;
  local_1068.ai_flags = 0;
  local_1068.ai_family = 0;
  local_1068.ai_socktype = 0;
  local_1068.ai_protocol = 0;
  iVar9 = detail::getAddressFamily(*pIVar24);
  local_1068.ai_family = iVar9;
  local_1068.ai_socktype = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pIVar24 + 0x28);
  iVar9 = getaddrinfo(*(char **)(pIVar24 + 0x28),*(char **)(pIVar24 + 0x48),&local_1068,&local_1078)
  ;
  if (iVar9 != 0) {
    this_02 = (system_error *)__cxa_allocate_exception(0x20);
    piVar17 = __errno_location();
    iVar9 = *piVar17;
    std::operator+(local_1038,"Failed to get address info of ",__rhs);
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_02,iVar9,__ecat,local_1038);
    __cxa_throw(this_02,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  local_10e0 = local_1078;
  local_11a8._M_dataplus._M_p = (pointer)&local_11a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_11a8,*__buf,*(long *)((long)__buf + 8) + *__buf);
  std::__cxx11::string::append((char *)&local_11a8);
  local_1138 = (vector<unsigned_char,std::allocator<unsigned_char>> *)pIVar24;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_11a8,*(undefined8 *)(pIVar24 + 0x68));
  paVar1 = &local_1038[0].field_2;
  psVar19 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_1038[0].field_2._0_8_ = *psVar19;
    local_1038[0].field_2._8_8_ = plVar10[3];
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1038[0].field_2._0_8_ = *psVar19;
    local_1038[0]._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1038[0]._M_string_length = plVar10[1];
  *plVar10 = (long)psVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)local_1038);
  local_10b8._M_current = (char *)&local_10a8;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_10a8 = *plVar11;
    lStack_10a0 = plVar10[3];
  }
  else {
    local_10a8 = *plVar11;
    local_10b8._M_current = (char *)*plVar10;
  }
  local_10b0 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  local_10d0 = __rhs;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11a8._M_dataplus._M_p != &local_11a8.field_2) {
    operator_delete(local_11a8._M_dataplus._M_p);
  }
  plVar10 = *(long **)CONCAT44(in_register_00000084,__flags);
  plVar11 = (long *)((long *)CONCAT44(in_register_00000084,__flags))[1];
  if (plVar10 != plVar11) {
    do {
      local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)local_1038,*plVar10,plVar10[1] + *plVar10)
      ;
      std::__cxx11::string::append((char *)local_1038);
      std::__cxx11::string::_M_append((char *)&local_10b8,(ulong)local_1038[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1038[0]._M_dataplus._M_p);
      }
      plVar10 = plVar10 + 4;
    } while (plVar10 != plVar11);
  }
  std::operator+(&local_1130,"Host: ",local_10d0);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1130);
  plVar10 = local_1110;
  puVar20 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar20) {
    local_1148 = *puVar20;
    lStack_1140 = plVar11[3];
    local_1158 = &local_1148;
  }
  else {
    local_1148 = *puVar20;
    local_1158 = (ulong *)*plVar11;
  }
  lStack_1150 = plVar11[1];
  *plVar11 = (long)puVar20;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  uVar30 = local_1110[1] - *local_1110;
  cVar25 = '\x01';
  if (9 < uVar30) {
    uVar32 = uVar30;
    cVar8 = '\x04';
    do {
      cVar25 = cVar8;
      if (uVar32 < 100) {
        cVar25 = cVar25 + -2;
        goto LAB_0014f839;
      }
      if (uVar32 < 1000) {
        cVar25 = cVar25 + -1;
        goto LAB_0014f839;
      }
      if (uVar32 < 10000) goto LAB_0014f839;
      bVar28 = 99999 < uVar32;
      uVar32 = uVar32 / 10000;
      cVar8 = cVar25 + '\x04';
    } while (bVar28);
    cVar25 = cVar25 + '\x01';
  }
LAB_0014f839:
  paVar2 = &local_1100.field_2;
  local_1100._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_1100,cVar25);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_1100._M_dataplus._M_p,(uint)local_1100._M_string_length,uVar30);
  uVar30 = CONCAT44(local_1100._M_string_length._4_4_,(uint)local_1100._M_string_length) +
           lStack_1150;
  uVar32 = 0xf;
  if (local_1158 != &local_1148) {
    uVar32 = local_1148;
  }
  lVar27 = lStack_1150;
  if (uVar32 < uVar30) {
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1100._M_dataplus._M_p != paVar2) {
      uVar26 = local_1100.field_2._M_allocated_capacity;
    }
    if (uVar30 <= (ulong)uVar26) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1100,0,(char *)0x0,(ulong)local_1158);
      goto LAB_0014f8d4;
    }
  }
  puVar12 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_1158,(ulong)local_1100._M_dataplus._M_p);
LAB_0014f8d4:
  puVar20 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_11a8.field_2._M_allocated_capacity = *puVar20;
    local_11a8.field_2._8_8_ = puVar12[3];
    local_11a8._M_dataplus._M_p = (pointer)&local_11a8.field_2;
  }
  else {
    local_11a8.field_2._M_allocated_capacity = *puVar20;
    local_11a8._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_11a8._M_string_length = puVar12[1];
  *puVar12 = puVar20;
  puVar12[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_11a8);
  psVar19 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_1038[0].field_2._0_8_ = *psVar19;
    local_1038[0].field_2._8_8_ = plVar11[3];
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1038[0].field_2._0_8_ = *psVar19;
    local_1038[0]._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_1038[0]._M_string_length = plVar11[1];
  *plVar11 = (long)psVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_10b8,(ulong)local_1038[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11a8._M_dataplus._M_p != &local_11a8.field_2) {
    operator_delete(local_11a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1100._M_dataplus._M_p != paVar2) {
    operator_delete(local_1100._M_dataplus._M_p);
  }
  if (local_1158 != &local_1148) {
    operator_delete(local_1158);
  }
  pvVar7 = local_1138;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1090,local_10b8,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_10b8._M_current + local_10b0),(allocator_type *)local_1038);
  __len = (socklen_t)plVar10[1];
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1090,local_1088,*plVar10)
  ;
  detail::Socket::Socket(&local_116c,*(InternetProtocol *)pvVar7);
  detail::Socket::connect
            (&local_116c,(int)local_10e0->ai_addr,(sockaddr *)(ulong)local_10e0->ai_addrlen,__len);
  __buf_00 = (void *)(local_1088 - (long)local_1090);
  if (__buf_00 != (void *)0x0) {
    pvVar22 = local_1090;
    do {
      sVar13 = detail::Socket::send(&local_116c,(int)pvVar22,__buf_00,0x4000,(int)lVar27);
      pvVar22 = (void *)((long)pvVar22 + sVar13);
      __buf_00 = (void *)((long)__buf_00 - sVar13);
    } while (__buf_00 != (void *)0x0);
  }
  local_11aa = 0xa0d;
  *(int *)local_1160 = 0;
  local_10d0 = &local_1160->scheme;
  (local_1160->scheme)._M_dataplus._M_p = (pointer)0x0;
  (local_1160->scheme)._M_string_length = 0;
  (local_1160->scheme).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(local_1160->scheme).field_2 + 8) = 0;
  (local_1160->domain)._M_dataplus._M_p = (pointer)0x0;
  (local_1160->domain)._M_string_length = 0;
  local_1188 = (uchar *)0x0;
  puStack_1180 = (uchar *)0x0;
  local_1178 = 0;
  local_1138 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
               ((long)&(local_1160->scheme).field_2 + 8);
  bVar28 = true;
  local_1108 = 0;
  local_1168 = 0;
  local_10c8 = 0;
  local_10d8 = 0;
  local_10c0 = 0;
  local_1110 = (long *)0x0;
LAB_0014fb2c:
  do {
    do {
      sVar13 = detail::Socket::recv(&local_116c,(int)local_1038,(void *)0x1000,0x4000,(int)lVar27);
      if (sVar13 == 0) goto LAB_00150264;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1188,puStack_1180,
                 local_1038,(long)&local_1038[0]._M_dataplus._M_p + sVar13);
      puVar21 = extraout_RDX;
      if (((ulong)local_1110 & 1) == 0) {
        do {
          _Var14 = std::
                   __search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                             (local_1188,puStack_1180,&local_11aa,&local_11a8);
          puVar21 = extraout_RDX_00;
          if (_Var14._M_current == puStack_1180) break;
          local_11a8._M_dataplus._M_p = (pointer)&local_11a8.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&local_11a8,local_1188,_Var14._M_current);
          puVar29 = local_1188;
          puVar31 = _Var14._M_current + 2;
          lVar15 = extraout_RAX;
          puVar21 = extraout_RDX_01;
          if (puVar31 != local_1188) {
            if ((long)puStack_1180 - (long)puVar31 == 0) {
              puVar21 = (uchar *)0x0;
              puVar33 = puVar31;
            }
            else {
              memmove(local_1188,puVar31,(long)puStack_1180 - (long)puVar31);
              puVar33 = puStack_1180;
              puVar21 = extraout_RDX_02;
            }
            lVar15 = (long)puVar33 - (long)puVar31;
            if (puVar33 != puVar29 + lVar15) {
              puStack_1180 = puVar29 + lVar15;
            }
          }
          sVar6 = local_11a8._M_string_length;
          if (local_11a8._M_string_length == 0) {
            local_1110 = (long *)CONCAT71((int7)((ulong)lVar15 >> 8),1);
          }
          else {
            cVar25 = (char)&local_11a8;
            if (bVar28) {
              local_1158 = (ulong *)0x0;
              lStack_1150 = 0;
              local_1148 = 0;
              uVar30 = local_11a8._M_string_length + 1;
              if (local_11a8._M_string_length != 0xffffffffffffffff) {
                uVar32 = 0;
                do {
                  sVar16 = std::__cxx11::string::find(cVar25,0x20);
                  if (sVar16 == 0xffffffffffffffff) {
                    sVar16 = sVar6;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(sVar16 - uVar32) !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    local_1130._M_dataplus._M_p = local_11a8._M_dataplus._M_p + uVar32;
                    local_1100._M_dataplus._M_p = (pointer)(sVar16 - uVar32);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*,unsigned_long>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_1158,(char **)&local_1130,(unsigned_long *)&local_1100);
                  }
                  uVar32 = sVar16 + 1;
                } while (uVar32 < uVar30);
              }
              if (0x20 < (ulong)(lStack_1150 - (long)local_1158)) {
                __nptr = (char *)local_1158[4];
                piVar17 = __errno_location();
                iVar9 = *piVar17;
                *piVar17 = 0;
                lVar15 = strtol(__nptr,(char **)&local_1130,10);
                if (local_1130._M_dataplus._M_p == __nptr) {
                  std::__throw_invalid_argument("stoi");
                }
                else if (((int)lVar15 == lVar15) && (*piVar17 != 0x22)) {
                  if (*piVar17 == 0) {
                    *piVar17 = iVar9;
                  }
                  *(int *)local_1160 = (int)lVar15;
                  goto LAB_0014fd1c;
                }
                std::__throw_out_of_range("stoi");
LAB_001502e5:
                std::__throw_invalid_argument("stoul");
LAB_001502f1:
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_1100,"Unsupported transfer encoding: ",&local_1130);
                std::runtime_error::runtime_error(this_00,(string *)&local_1100);
                *(undefined ***)this_00 = &PTR__runtime_error_001819a0;
                __cxa_throw(this_00,&ResponseError::typeinfo,std::runtime_error::~runtime_error);
              }
LAB_0014fd1c:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_1158);
              bVar28 = false;
              puVar21 = extraout_RDX_03;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_10d0,&local_11a8);
              bVar28 = false;
              auVar34 = std::__cxx11::string::find(cVar25,0x3a);
              puVar21 = auVar34._8_8_;
              if (auVar34._0_8_ != -1) {
                std::__cxx11::string::substr((ulong)&local_1158,(ulong)&local_11a8);
                std::__cxx11::string::substr((ulong)&local_1130,(ulong)&local_11a8);
                _Var5._M_p = local_1130._M_dataplus._M_p;
                _Var18 = std::
                         __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_1_>>
                                   (local_1130._M_dataplus._M_p,
                                    local_1130._M_dataplus._M_p + local_1130._M_string_length);
                uVar30 = (long)_Var5._M_p - (long)local_1130._M_dataplus._M_p;
                if (local_1130._M_dataplus._M_p + local_1130._M_string_length == _Var18._M_current)
                {
                  local_1130._M_dataplus._M_p[uVar30] = '\0';
                  local_1130._M_string_length = uVar30;
                }
                else {
                  std::__cxx11::string::_M_erase((ulong)&local_1130,uVar30);
                }
                local_1100._M_dataplus._M_p =
                     local_1130._M_dataplus._M_p + local_1130._M_string_length;
                local_1070 = local_1130._M_dataplus._M_p;
                std::
                __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_2_>>
                          (&local_1098,&local_1100,&local_1070);
                uVar30 = (long)local_1098 - (long)local_1130._M_dataplus._M_p;
                *local_1098 = 0;
                local_1130._M_string_length = uVar30;
                iVar9 = std::__cxx11::string::compare((char *)&local_1158);
                _Var5._M_p = local_1130._M_dataplus._M_p;
                if (iVar9 == 0) {
                  piVar17 = __errno_location();
                  iVar9 = *piVar17;
                  *piVar17 = 0;
                  local_10d8 = strtoul(_Var5._M_p,(char **)&local_1100,10);
                  if (local_1100._M_dataplus._M_p == _Var5._M_p) goto LAB_001502e5;
                  iVar3 = *piVar17;
                  if (iVar3 == 0) {
                    *piVar17 = iVar9;
                  }
                  else if (iVar3 == 0x22) {
                    std::__throw_out_of_range("stoul");
                    goto LAB_00150360;
                  }
                  local_10c0 = CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1138,
                             local_10d8);
                  puVar21 = extraout_RDX_06;
                }
                else {
                  iVar9 = std::__cxx11::string::compare((char *)&local_1158);
                  puVar21 = extraout_RDX_04;
                  if (iVar9 == 0) {
                    iVar9 = std::__cxx11::string::compare((char *)&local_1130);
                    local_10c8 = CONCAT71((int7)(uVar30 >> 8),1);
                    puVar21 = extraout_RDX_05;
                    if (iVar9 != 0) goto LAB_001502f1;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
                  operator_delete(local_1130._M_dataplus._M_p);
                  puVar21 = extraout_RDX_07;
                }
                if (local_1158 != &local_1148) {
                  operator_delete(local_1158);
                  puVar21 = extraout_RDX_08;
                }
                bVar28 = false;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_11a8._M_dataplus._M_p != &local_11a8.field_2) {
            operator_delete(local_11a8._M_dataplus._M_p);
            puVar21 = extraout_RDX_09;
          }
        } while (sVar6 != 0);
      }
    } while (((ulong)local_1110 & 1) == 0);
    uVar30 = local_1108;
    if ((local_10c8 & 1) != 0) {
      do {
        while (puVar31 = puStack_1180, puVar29 = local_1188, uVar30 != 0) {
          uVar23 = (long)puStack_1180 - (long)local_1188;
          uVar32 = uVar30;
          if (uVar23 < uVar30) {
            uVar32 = uVar23;
          }
          local_1108 = uVar30;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_1138,(local_1160->domain)._M_dataplus._M_p,local_1188,local_1188 + uVar32
                    );
          puVar33 = local_1188;
          puVar21 = puStack_1180;
          if (puVar31 != puVar29) {
            puVar29 = local_1188 + uVar32;
            puVar21 = puVar29;
            if ((long)puStack_1180 - (long)puVar29 != 0) {
              memmove(local_1188,puVar29,(long)puStack_1180 - (long)puVar29);
              puVar21 = puStack_1180;
            }
            puVar33 = puVar33 + ((long)puVar21 - (long)puVar29);
            if (puVar21 != puVar33) {
              puVar21 = puVar33;
              puStack_1180 = puVar33;
            }
          }
          uVar30 = local_1108 - uVar32;
          local_1168 = CONCAT71((int7)(local_1168 >> 8),(byte)local_1168 | local_1108 <= uVar23);
          if (local_1188 == puVar21) {
            bVar4 = true;
            goto LAB_0015024f;
          }
        }
        if ((local_1168 & 1) != 0) {
          if ((ulong)((long)puStack_1180 - (long)local_1188) < 2) {
            bVar4 = true;
            uVar30 = 0;
            local_1168 = CONCAT71((int7)((ulong)puVar21 >> 8),1);
            goto LAB_0015024f;
          }
          puVar21 = local_1188 + 2;
          puVar31 = puVar21;
          if ((long)puStack_1180 - (long)puVar21 != 0) {
            memmove(local_1188,puVar21,(long)puStack_1180 - (long)puVar21);
            puVar31 = puStack_1180;
          }
          puVar29 = puVar29 + ((long)puVar31 - (long)puVar21);
          if (puStack_1180 != puVar29) {
            puStack_1180 = puVar29;
          }
        }
        _Var14 = std::
                 __search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (local_1188,puStack_1180,&local_11aa);
        if (_Var14._M_current == puStack_1180) {
          bVar4 = true;
          uVar30 = 0;
          local_1168 = 0;
          goto LAB_0015024f;
        }
        local_11a8._M_dataplus._M_p = (pointer)&local_11a8.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((string *)&local_11a8,local_1188,_Var14._M_current);
        puVar21 = local_1188;
        puVar29 = _Var14._M_current + 2;
        if (puVar29 != local_1188) {
          puVar31 = puVar29;
          if ((long)puStack_1180 - (long)puVar29 != 0) {
            memmove(local_1188,puVar29,(long)puStack_1180 - (long)puVar29);
            puVar31 = puStack_1180;
          }
          if (puVar31 != puVar21 + ((long)puVar31 - (long)puVar29)) {
            puStack_1180 = puVar21 + ((long)puVar31 - (long)puVar29);
          }
        }
        _Var5._M_p = local_11a8._M_dataplus._M_p;
        piVar17 = __errno_location();
        local_1168 = CONCAT44(local_1168._4_4_,*piVar17);
        *piVar17 = 0;
        uVar30 = strtoul(_Var5._M_p,(char **)&local_1158,0x10);
        if (local_1158 == (ulong *)_Var5._M_p) goto LAB_00150360;
        if (*piVar17 == 0) {
          *piVar17 = (int)local_1168;
        }
        else if (*piVar17 == 0x22) goto LAB_0015036c;
        puVar21 = extraout_RDX_10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_11a8._M_dataplus._M_p != &local_11a8.field_2) {
          operator_delete(local_11a8._M_dataplus._M_p);
          puVar21 = extraout_RDX_11;
        }
        local_1168 = 0;
      } while (uVar30 != 0);
      uVar30 = 0;
      bVar4 = false;
LAB_0015024f:
      local_1108 = uVar30;
      if (!bVar4) goto LAB_00150264;
      goto LAB_0014fb2c;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_1138,(local_1160->domain)._M_dataplus._M_p,local_1188,puStack_1180);
    if (puStack_1180 != local_1188) {
      puStack_1180 = local_1188;
    }
    if (((local_10c0 & 1) != 0) &&
       (local_10d8 <= (ulong)((long)(local_1160->domain)._M_dataplus._M_p - *(long *)local_1138))) {
LAB_00150264:
      if (local_1188 != (uchar *)0x0) {
        operator_delete(local_1188);
      }
      detail::Socket::~Socket(&local_116c);
      if (local_1090 != (void *)0x0) {
        operator_delete(local_1090);
      }
      if ((long *)local_10b8._M_current != &local_10a8) {
        operator_delete(local_10b8._M_current);
      }
      if (local_10e0 != (addrinfo *)0x0) {
        freeaddrinfo(local_10e0);
      }
      return (ssize_t)local_1160;
    }
  } while( true );
LAB_00150360:
  std::__throw_invalid_argument("stoul");
LAB_0015036c:
  std::__throw_out_of_range("stoul");
  goto LAB_00150378;
}

Assistant:

Response send(const std::string& method,
                      const std::vector<uint8_t>& body,
                      const std::vector<std::string>& headers)
        {
            if (scheme != "http")
                throw RequestError("Only HTTP scheme is supported");

            addrinfo hints = {};
            hints.ai_family = getAddressFamily(internetProtocol);
            hints.ai_socktype = SOCK_STREAM;

            addrinfo* info;
            if (getaddrinfo(domain.c_str(), port.c_str(), &hints, &info) != 0)
                throw std::system_error(getLastError(), std::system_category(), "Failed to get address info of " + domain);

            std::unique_ptr<addrinfo, decltype(&freeaddrinfo)> addressInfo(info, freeaddrinfo);

            std::string headerData = method + " " + path + " HTTP/1.1\r\n";

            for (const std::string& header : headers)
                headerData += header + "\r\n";

            headerData += "Host: " + domain + "\r\n"
                "Content-Length: " + std::to_string(body.size()) + "\r\n"
                "\r\n";

            std::vector<uint8_t> requestData(headerData.begin(), headerData.end());
            requestData.insert(requestData.end(), body.begin(), body.end());

            Socket socket(internetProtocol);

            // take the first address from the list
            socket.connect(addressInfo->ai_addr, static_cast<socklen_t>(addressInfo->ai_addrlen));

            auto remaining = requestData.size();
            auto sendData = requestData.data();

            // send the request
            while (remaining > 0)
            {
                const auto size = socket.send(sendData, remaining, noSignal);
                remaining -= size;
                sendData += size;
            }

            std::uint8_t tempBuffer[4096];
            constexpr std::uint8_t crlf[] = {'\r', '\n'};
            Response response;
            std::vector<std::uint8_t> responseData;
            bool firstLine = true;
            bool parsedHeaders = false;
            bool contentLengthReceived = false;
            unsigned long contentLength = 0;
            bool chunkedResponse = false;
            std::size_t expectedChunkSize = 0;
            bool removeCrlfAfterChunk = false;

            // read the response
            for (;;)
            {
                const auto size = socket.recv(tempBuffer, sizeof(tempBuffer), noSignal);

                if (size == 0)
                    break; // disconnected

                responseData.insert(responseData.end(), tempBuffer, tempBuffer + size);

                if (!parsedHeaders)
                    for (;;)
                    {
                        const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                        // didn't find a newline
                        if (i == responseData.end()) break;

                        const std::string line(responseData.begin(), i);
                        responseData.erase(responseData.begin(), i + 2);

                        // empty line indicates the end of the header section
                        if (line.empty())
                        {
                            parsedHeaders = true;
                            break;
                        }
                        else if (firstLine) // first line
                        {
                            firstLine = false;

                            std::string::size_type lastPos = 0;
                            const auto length = line.length();
                            std::vector<std::string> parts;

                            // tokenize first line
                            while (lastPos < length + 1)
                            {
                                auto pos = line.find(' ', lastPos);
                                if (pos == std::string::npos) pos = length;

                                if (pos != lastPos)
                                    parts.emplace_back(line.data() + lastPos,
                                                       static_cast<std::vector<std::string>::size_type>(pos) - lastPos);

                                lastPos = pos + 1;
                            }

                            if (parts.size() >= 2)
                                response.status = std::stoi(parts[1]);
                        }
                        else // headers
                        {
                            response.headers.push_back(line);

                            const auto pos = line.find(':');

                            if (pos != std::string::npos)
                            {
                                std::string headerName = line.substr(0, pos);
                                std::string headerValue = line.substr(pos + 1);

                                // ltrim
                                headerValue.erase(headerValue.begin(),
                                                  std::find_if(headerValue.begin(), headerValue.end(),
                                                               [](int c) {return !std::isspace(c);}));

                                // rtrim
                                headerValue.erase(std::find_if(headerValue.rbegin(), headerValue.rend(),
                                                               [](int c) {return !std::isspace(c);}).base(),
                                                  headerValue.end());

                                if (headerName == "Content-Length")
                                {
                                    contentLength = std::stoul(headerValue);
                                    contentLengthReceived = true;
                                    response.body.reserve(contentLength);
                                }
                                else if (headerName == "Transfer-Encoding")
                                {
                                    if (headerValue == "chunked")
                                        chunkedResponse = true;
                                    else
                                        throw ResponseError("Unsupported transfer encoding: " + headerValue);
                                }
                            }
                        }
                    }

                if (parsedHeaders)
                {
                    // Content-Length must be ignored if Transfer-Encoding is received
                    if (chunkedResponse)
                    {
                        bool dataReceived = false;
                        for (;;)
                        {
                            if (expectedChunkSize > 0)
                            {
                                const auto toWrite = std::min(expectedChunkSize, responseData.size());
                                response.body.insert(response.body.end(), responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                responseData.erase(responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                expectedChunkSize -= toWrite;

                                if (expectedChunkSize == 0) removeCrlfAfterChunk = true;
                                if (responseData.empty()) break;
                            }
                            else
                            {
                                if (removeCrlfAfterChunk)
                                {
                                    if (responseData.size() >= 2)
                                    {
                                        removeCrlfAfterChunk = false;
                                        responseData.erase(responseData.begin(), responseData.begin() + 2);
                                    }
                                    else break;
                                }

                                const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                                if (i == responseData.end()) break;

                                const std::string line(responseData.begin(), i);
                                responseData.erase(responseData.begin(), i + 2);

                                expectedChunkSize = std::stoul(line, nullptr, 16);

                                if (expectedChunkSize == 0)
                                {
                                    dataReceived = true;
                                    break;
                                }
                            }
                        }

                        if (dataReceived)
                            break;
                    }
                    else
                    {
                        response.body.insert(response.body.end(), responseData.begin(), responseData.end());
                        responseData.clear();

                        // got the whole content
                        if (contentLengthReceived && response.body.size() >= contentLength)
                            break;
                    }
                }
            }

            return response;
        }